

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

void opj_tls_destroy(opj_tls_t *tls)

{
  code *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (tls != (opj_tls_t *)0x0) {
    iVar2 = tls->key_val_count;
    if (0 < iVar2) {
      lVar3 = 0x10;
      lVar4 = 0;
      do {
        pcVar1 = *(code **)((long)&tls->key_val->key + lVar3);
        if (pcVar1 != (code *)0x0) {
          (*pcVar1)(*(undefined8 *)((long)tls->key_val + lVar3 + -8));
          iVar2 = tls->key_val_count;
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (lVar4 < iVar2);
    }
    opj_free(tls->key_val);
    opj_free(tls);
    return;
  }
  return;
}

Assistant:

static void opj_tls_destroy(opj_tls_t* tls)
{
    int i;
    if (!tls) {
        return;
    }
    for (i = 0; i < tls->key_val_count; i++) {
        if (tls->key_val[i].opj_free_func) {
            tls->key_val[i].opj_free_func(tls->key_val[i].value);
        }
    }
    opj_free(tls->key_val);
    opj_free(tls);
}